

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_modsub(mp_int *x,mp_int *y,mp_int *modulus)

{
  uint yes;
  uint uVar1;
  mp_int *r;
  mp_int *r_00;
  ulong nw;
  
  nw = y->nw;
  if (y->nw < x->nw) {
    nw = x->nw;
  }
  r = mp_make_sized(nw);
  mp_sub_into(r,x,y);
  yes = mp_cmp_hs(y,x);
  mp_cond_negate(r,r,yes);
  r_00 = mp_mod(r,modulus);
  mp_cond_negate(r_00,r_00,yes);
  uVar1 = mp_eq_integer(r_00,0);
  mp_cond_add_into(r_00,r_00,modulus,yes & ~uVar1);
  mp_free(r);
  return r_00;
}

Assistant:

mp_int *mp_modsub(mp_int *x, mp_int *y, mp_int *modulus)
{
    mp_int *diff = mp_make_sized(size_t_max(x->nw, y->nw));
    mp_sub_into(diff, x, y);
    unsigned negate = mp_cmp_hs(y, x);
    mp_cond_negate(diff, diff, negate);
    mp_int *residue = mp_mod(diff, modulus);
    mp_cond_negate(residue, residue, negate);
    /* If we've just negated the residue, then it will be < 0 and need
     * the modulus adding to it to make it positive - *except* if the
     * residue was zero when we negated it. */
    unsigned make_positive = negate & ~mp_eq_integer(residue, 0);
    mp_cond_add_into(residue, residue, modulus, make_positive);
    mp_free(diff);
    return residue;
}